

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O0

void api_suite::api_lower_bound(void)

{
  const_iterator pvVar1;
  iterator pvVar2;
  pair<int,_int> (*in_RDX) [4];
  key_type local_6c [9];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [8];
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  
  local_38 = 0x300000021;
  uStack_30 = 0x10000000b;
  local_48 = 0x200000016;
  uStack_40 = 0x40000002c;
  vista::make_constant_map<int,int,4ul,std::less<int>>
            ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,(vista *)&local_48,in_RDX);
  local_6c[8] = 10;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 8);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(10) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x78,"void api_suite::api_lower_bound()",pvVar1 == pvVar2);
  local_6c[7] = 0xb;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 7);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(11) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x79,"void api_suite::api_lower_bound()",pvVar1 == pvVar2);
  local_6c[6] = 0xc;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 6);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(12) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7a,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 1);
  local_6c[5] = 0x16;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 5);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(22) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7b,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 1);
  local_6c[4] = 0x17;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 4);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(23) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7c,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 2);
  local_6c[3] = 0x21;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 3);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(33) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7d,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 2);
  local_6c[2] = 0x22;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 2);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(34) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7e,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 3);
  local_6c[1] = 0x2c;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c + 1);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::begin
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(44) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7f,"void api_suite::api_lower_bound()",pvVar1 == pvVar2 + 3);
  local_6c[0] = 0x2d;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound
                     ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,local_6c);
  pvVar2 = std::array<vista::pair<int,_int>,_4UL>::end
                     ((array<vista::pair<int,_int>,_4UL> *)local_28);
  boost::detail::test_impl
            ("map.lower_bound(45) == map.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x80,"void api_suite::api_lower_bound()",(bool)(-(pvVar1 == pvVar2) & 1));
  return;
}

Assistant:

void api_lower_bound()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST(map.lower_bound(10) == map.begin());
    BOOST_TEST(map.lower_bound(11) == map.begin());
    BOOST_TEST(map.lower_bound(12) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(22) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(23) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(33) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(34) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(44) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(45) == map.end());
}